

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O1

void testYca(string *tempDir)

{
  pointer pcVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  int readOrder;
  LineOrder readOrder_00;
  int i;
  LineOrder writeOrder;
  ulong uVar7;
  Box2i *dw;
  bool bVar8;
  string fileName;
  long *local_c0 [2];
  long local_b0 [2];
  ulong local_a0;
  Box2i local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing luminance/chroma input and output",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_c0[0] = local_b0;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_c0);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&local_98.min.x + lVar5) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)&local_98.max.x + lVar5) = 0x8000000080000000;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x60);
  local_98.min.x = 0;
  local_98.min.y = 0;
  local_98.max.x = 1;
  local_98.max.y = 0x11;
  local_88 = 0;
  uStack_80 = 0x1100000005;
  local_78 = 0;
  uStack_70 = 0x100000011;
  local_68 = 0;
  uStack_60 = 0x500000011;
  local_58 = 0;
  uStack_50 = 0x100000001;
  local_48 = 0xffffffe4ffffffee;
  uStack_40 = 0xff000000f7;
  bVar2 = IlmThread_3_2::supportsThreads();
  uVar7 = 0;
  do {
    cVar3 = IlmThread_3_2::supportsThreads();
    if (cVar3 != '\0') {
      Imf_3_2::setGlobalThreadCount((int)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar4 = Imf_3_2::globalThreadCount();
      plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    lVar5 = 0;
    local_a0 = uVar7;
    do {
      dw = &local_98 + lVar5;
      writeOrder = INCREASING_Y;
      do {
        readOrder_00 = INCREASING_Y;
        do {
          anon_unknown.dwarf_33efff::writeReadYca
                    ((char *)local_c0[0],dw,WRITE_YCA,writeOrder,readOrder_00,
                     anon_unknown.dwarf_33efff::fillPixelsColor);
          anon_unknown.dwarf_33efff::writeReadYca
                    ((char *)local_c0[0],dw,WRITE_YC,writeOrder,readOrder_00,
                     anon_unknown.dwarf_33efff::fillPixelsColor);
          anon_unknown.dwarf_33efff::writeReadYca
                    ((char *)local_c0[0],dw,WRITE_YA,writeOrder,readOrder_00,
                     anon_unknown.dwarf_33efff::fillPixelsGray);
          anon_unknown.dwarf_33efff::writeReadYca
                    ((char *)local_c0[0],dw,WRITE_Y,writeOrder,readOrder_00,
                     anon_unknown.dwarf_33efff::fillPixelsGray);
          readOrder_00 = readOrder_00 + DECREASING_Y;
        } while (readOrder_00 != NUM_LINEORDERS);
        bVar8 = writeOrder == INCREASING_Y;
        writeOrder = writeOrder + DECREASING_Y;
      } while (bVar8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    uVar7 = (ulong)((uint)local_a0 + 1);
  } while ((bVar2 & (uint)local_a0 < 3) != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  return;
}

Assistant:

void
testYca (const std::string& tempDir)
{
    try
    {
        cout << "Testing luminance/chroma input and output" << endl;

        std::string fileName = tempDir + "imf_test_yca.exr";

        Box2i dataWindow[6];
        dataWindow[0] = Box2i (V2i (0, 0), V2i (1, 17));
        dataWindow[1] = Box2i (V2i (0, 0), V2i (5, 17));
        dataWindow[2] = Box2i (V2i (0, 0), V2i (17, 1));
        dataWindow[3] = Box2i (V2i (0, 0), V2i (17, 5));
        dataWindow[4] = Box2i (V2i (0, 0), V2i (1, 1));
        dataWindow[5] = Box2i (V2i (-18, -28), V2i (247, 255));

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            for (int i = 0; i < 6; ++i)
            {
                for (int writeOrder = INCREASING_Y; writeOrder <= DECREASING_Y;
                     ++writeOrder)
                {
                    for (int readOrder = INCREASING_Y; readOrder <= RANDOM_Y;
                         ++readOrder)
                    {
                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_YCA,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsColor);

                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_YC,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsColor);

                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_YA,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsGray);

                        writeReadYca (
                            fileName.c_str (),
                            dataWindow[i],
                            WRITE_Y,
                            LineOrder (writeOrder),
                            LineOrder (readOrder),
                            fillPixelsGray);
                    }
                }
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}